

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstToYaml.cpp
# Opt level: O2

string * __thiscall
MyCompiler::Util::astToYaml_abi_cxx11_(string *__return_storage_ptr__,Util *this,Program *ast)

{
  pointer ppVar1;
  ostream *poVar2;
  pointer ppVar3;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  ostringstream out;
  
  items.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  items.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  items.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&out,"program",(allocator *)local_1c8);
  processAst<MyCompiler::Program>((Program *)this,0,&items,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  ppVar1 = items.
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = items.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct((ulong)local_1c8,(char)ppVar3->first * '\x02');
    poVar2 = std::operator<<((ostream *)&out,(string *)local_1c8);
    poVar2 = std::operator<<(poVar2,(string *)&ppVar3->second);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)local_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&items);
  return __return_storage_ptr__;
}

Assistant:

std::string MyCompiler::Util::astToYaml(Program &ast)
{
    std::vector<std::pair<int, std::string>> items;
    processAst<Program>(ast, 0, items, "program");
    std::ostringstream out;
    for (auto &item : items)
        out << std::string(item.first * 2, ' ') << item.second << std::endl;
    return out.str();
}